

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_particleSpectra.cpp
# Opt level: O0

void __thiscall
singleParticleSpectra::calculate_three_particle_correlation_charge_dep
          (singleParticleSpectra *this,vector<double,_std::allocator<double>_> *event_Qn_p_real,
          vector<double,_std::allocator<double>_> *event_Qn_p_imag,
          vector<double,_std::allocator<double>_> *event_Qn_m_real,
          vector<double,_std::allocator<double>_> *event_Qn_m_imag,
          vector<double,_std::allocator<double>_> *event_Qn_real,
          vector<double,_std::allocator<double>_> *event_Qn_imag,
          vector<double,_std::allocator<double>_> *corr_ss,
          vector<double,_std::allocator<double>_> *corr_ss_err,
          vector<double,_std::allocator<double>_> *corr_os,
          vector<double,_std::allocator<double>_> *corr_os_err,
          vector<double,_std::allocator<double>_> *corr_ss_13,
          vector<double,_std::allocator<double>_> *corr_ss_13_err,
          vector<double,_std::allocator<double>_> *corr_os_13,
          vector<double,_std::allocator<double>_> *corr_os_13_err)

{
  double dVar1;
  reference pvVar2;
  long in_RDI;
  double dVar3;
  double dVar4;
  vector<double,_std::allocator<double>_> *in_stack_00000010;
  vector<double,_std::allocator<double>_> *in_stack_00000018;
  vector<double,_std::allocator<double>_> *in_stack_00000020;
  vector<double,_std::allocator<double>_> *in_stack_00000028;
  vector<double,_std::allocator<double>_> *in_stack_00000030;
  vector<double,_std::allocator<double>_> *in_stack_00000038;
  vector<double,_std::allocator<double>_> *in_stack_00000040;
  vector<double,_std::allocator<double>_> *in_stack_00000048;
  double local_Cmnk_os_13;
  double local_Cmnk_os;
  int i_1;
  vector<double,_std::allocator<double>_> temp_Cmnk_os_4_err;
  vector<double,_std::allocator<double>_> temp_Cmnk_os_3_err;
  vector<double,_std::allocator<double>_> temp_Cmnk_os_2_err;
  vector<double,_std::allocator<double>_> temp_Cmnk_os_1_err;
  vector<double,_std::allocator<double>_> temp_Cmnk_os_4;
  vector<double,_std::allocator<double>_> temp_Cmnk_os_3;
  vector<double,_std::allocator<double>_> temp_Cmnk_os_2;
  vector<double,_std::allocator<double>_> temp_Cmnk_os_1;
  double local_Cmnk_ss_13;
  double local_Cmnk_ss;
  int i;
  vector<double,_std::allocator<double>_> temp_Cmnk_ss_4_err;
  vector<double,_std::allocator<double>_> temp_Cmnk_ss_3_err;
  vector<double,_std::allocator<double>_> temp_Cmnk_ss_2_err;
  vector<double,_std::allocator<double>_> temp_Cmnk_ss_1_err;
  vector<double,_std::allocator<double>_> temp_Cmnk_ss_4;
  vector<double,_std::allocator<double>_> temp_Cmnk_ss_3;
  vector<double,_std::allocator<double>_> temp_Cmnk_ss_2;
  vector<double,_std::allocator<double>_> temp_Cmnk_ss_1;
  allocator_type *in_stack_fffffffffffffb88;
  allocator_type *__a;
  value_type *in_stack_fffffffffffffb90;
  value_type *__value;
  vector<double,_std::allocator<double>_> *this_00;
  size_type in_stack_fffffffffffffb98;
  value_type vVar5;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffba0;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd30;
  int iVar6;
  undefined4 in_stack_fffffffffffffd34;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffd38;
  vector<double,_std::allocator<double>_> *event_Q2_real;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffd40;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffd48;
  singleParticleSpectra *in_stack_fffffffffffffd50;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffd60;
  vector<double,_std::allocator<double>_> *event_Q3_imag;
  int in_stack_fffffffffffffd68;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffd70;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffd78;
  vector<double,_std::allocator<double>_> local_220;
  undefined8 local_200;
  vector<double,_std::allocator<double>_> local_1f8;
  undefined8 local_1d8;
  vector<double,_std::allocator<double>_> local_1d0;
  undefined8 local_1b0;
  vector<double,_std::allocator<double>_> local_1a8;
  double local_190;
  double local_188;
  int local_180;
  undefined8 local_178;
  value_type local_170 [4];
  undefined8 local_150;
  undefined8 local_128;
  undefined8 local_100;
  undefined8 local_d8;
  vector<double,_std::allocator<double>_> local_d0;
  undefined8 local_b0;
  vector<double,_std::allocator<double>_> local_a8;
  undefined8 local_88;
  vector<double,_std::allocator<double>_> local_80 [2];
  undefined8 local_50;
  vector<double,_std::allocator<double>_> local_48 [3];
  
  local_50 = 0;
  std::allocator<double>::allocator((allocator<double> *)0x16b3ff);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,in_stack_fffffffffffffb90,
             in_stack_fffffffffffffb88);
  std::allocator<double>::~allocator((allocator<double> *)0x16b433);
  local_88 = 0;
  std::allocator<double>::allocator((allocator<double> *)0x16b46b);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,in_stack_fffffffffffffb90,
             in_stack_fffffffffffffb88);
  std::allocator<double>::~allocator((allocator<double> *)0x16b49f);
  local_b0 = 0;
  std::allocator<double>::allocator((allocator<double> *)0x16b4d7);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,in_stack_fffffffffffffb90,
             in_stack_fffffffffffffb88);
  std::allocator<double>::~allocator((allocator<double> *)0x16b50b);
  local_d8 = 0;
  std::allocator<double>::allocator((allocator<double> *)0x16b543);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,in_stack_fffffffffffffb90,
             in_stack_fffffffffffffb88);
  std::allocator<double>::~allocator((allocator<double> *)0x16b577);
  local_100 = 0;
  std::allocator<double>::allocator((allocator<double> *)0x16b5af);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,in_stack_fffffffffffffb90,
             in_stack_fffffffffffffb88);
  std::allocator<double>::~allocator((allocator<double> *)0x16b5e3);
  local_128 = 0;
  std::allocator<double>::allocator((allocator<double> *)0x16b61b);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,in_stack_fffffffffffffb90,
             in_stack_fffffffffffffb88);
  std::allocator<double>::~allocator((allocator<double> *)0x16b64f);
  local_150 = 0;
  std::allocator<double>::allocator((allocator<double> *)0x16b687);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,in_stack_fffffffffffffb90,
             in_stack_fffffffffffffb88);
  std::allocator<double>::~allocator((allocator<double> *)0x16b6bb);
  local_178 = 0;
  std::allocator<double>::allocator((allocator<double> *)0x16b6f3);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,in_stack_fffffffffffffb90,
             in_stack_fffffffffffffb88);
  std::allocator<double>::~allocator((allocator<double> *)0x16b727);
  calculate_three_particle_correlation
            (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,
             in_stack_fffffffffffffd38,
             (vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),in_stack_fffffffffffffd28
             ,in_stack_fffffffffffffd60,in_stack_fffffffffffffd68,in_stack_fffffffffffffd70,
             in_stack_fffffffffffffd78);
  calculate_three_particle_correlation
            (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,
             in_stack_fffffffffffffd38,
             (vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),in_stack_fffffffffffffd28
             ,in_stack_fffffffffffffd60,in_stack_fffffffffffffd68,in_stack_fffffffffffffd70,
             in_stack_fffffffffffffd78);
  calculate_three_particle_correlation
            (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,
             in_stack_fffffffffffffd38,
             (vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),in_stack_fffffffffffffd28
             ,in_stack_fffffffffffffd60,in_stack_fffffffffffffd68,in_stack_fffffffffffffd70,
             in_stack_fffffffffffffd78);
  __value = local_170;
  __a = (allocator_type *)&local_d0;
  calculate_three_particle_correlation
            (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,
             in_stack_fffffffffffffd38,
             (vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),in_stack_fffffffffffffd28
             ,in_stack_fffffffffffffd60,in_stack_fffffffffffffd68,in_stack_fffffffffffffd70,
             in_stack_fffffffffffffd78);
  for (local_180 = 0; local_180 < *(int *)(in_RDI + 0x538); local_180 = local_180 + 1) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](local_48,(long)local_180);
    dVar4 = *pvVar2;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](local_80,(long)local_180);
    dVar3 = *pvVar2;
    local_188 = dVar4 + dVar3;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       (in_stack_00000010,(long)local_180);
    dVar1 = local_188;
    *pvVar2 = dVar4 + dVar3 + *pvVar2;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       (in_stack_00000018,(long)local_180);
    *pvVar2 = dVar1 * dVar1 + *pvVar2;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_a8,(long)local_180);
    dVar4 = *pvVar2;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_d0,(long)local_180);
    dVar3 = *pvVar2;
    local_190 = dVar4 + dVar3;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       (in_stack_00000030,(long)local_180);
    dVar1 = local_190;
    *pvVar2 = dVar4 + dVar3 + *pvVar2;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       (in_stack_00000038,(long)local_180);
    *pvVar2 = dVar1 * dVar1 + *pvVar2;
  }
  local_1b0 = 0;
  std::allocator<double>::allocator((allocator<double> *)0x16bc06);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,__value,__a);
  std::allocator<double>::~allocator((allocator<double> *)0x16bc3a);
  local_1d8 = 0;
  std::allocator<double>::allocator((allocator<double> *)0x16bc72);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,__value,__a);
  std::allocator<double>::~allocator((allocator<double> *)0x16bca6);
  local_200 = 0;
  std::allocator<double>::allocator((allocator<double> *)0x16bcde);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,__value,__a);
  std::allocator<double>::~allocator((allocator<double> *)0x16bd12);
  std::allocator<double>::allocator((allocator<double> *)0x16bd4a);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,__value,__a);
  std::allocator<double>::~allocator((allocator<double> *)0x16bd7e);
  std::allocator<double>::allocator((allocator<double> *)0x16bdb6);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,__value,__a);
  std::allocator<double>::~allocator((allocator<double> *)0x16bdea);
  std::allocator<double>::allocator((allocator<double> *)0x16be22);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,__value,__a);
  std::allocator<double>::~allocator((allocator<double> *)0x16be56);
  event_Q3_imag = (vector<double,_std::allocator<double>_> *)0x0;
  std::allocator<double>::allocator((allocator<double> *)0x16be88);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,__value,__a);
  std::allocator<double>::~allocator((allocator<double> *)0x16beb6);
  event_Q2_real = (vector<double,_std::allocator<double>_> *)0x0;
  std::allocator<double>::allocator((allocator<double> *)0x16bee8);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,__value,__a);
  std::allocator<double>::~allocator((allocator<double> *)0x16bf16);
  calculate_three_particle_correlation
            (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,
             event_Q2_real,
             (vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),in_stack_fffffffffffffd28
             ,event_Q3_imag,in_stack_fffffffffffffd68,in_stack_fffffffffffffd70,
             in_stack_fffffffffffffd78);
  calculate_three_particle_correlation
            (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,
             event_Q2_real,
             (vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),in_stack_fffffffffffffd28
             ,event_Q3_imag,in_stack_fffffffffffffd68,in_stack_fffffffffffffd70,
             in_stack_fffffffffffffd78);
  calculate_three_particle_correlation
            (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,
             event_Q2_real,
             (vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),in_stack_fffffffffffffd28
             ,event_Q3_imag,in_stack_fffffffffffffd68,in_stack_fffffffffffffd70,
             in_stack_fffffffffffffd78);
  this_00 = (vector<double,_std::allocator<double>_> *)&stack0xfffffffffffffd40;
  calculate_three_particle_correlation
            (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,
             event_Q2_real,
             (vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),in_stack_fffffffffffffd28
             ,event_Q3_imag,in_stack_fffffffffffffd68,in_stack_fffffffffffffd70,
             in_stack_fffffffffffffd78);
  for (iVar6 = 0; iVar6 < *(int *)(in_RDI + 0x538); iVar6 = iVar6 + 1) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_1a8,(long)iVar6);
    vVar5 = *pvVar2;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_1d0,(long)iVar6);
    dVar3 = vVar5 + *pvVar2;
    dVar4 = dVar3;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](in_stack_00000020,(long)iVar6)
    ;
    *pvVar2 = dVar3 + *pvVar2;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](in_stack_00000028,(long)iVar6)
    ;
    *pvVar2 = dVar4 * dVar4 + *pvVar2;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_1f8,(long)iVar6);
    dVar4 = *pvVar2;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_220,(long)iVar6);
    dVar4 = dVar4 + *pvVar2;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](in_stack_00000040,(long)iVar6)
    ;
    *pvVar2 = dVar4 + *pvVar2;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](in_stack_00000048,(long)iVar6)
    ;
    *pvVar2 = dVar4 * dVar4 + *pvVar2;
  }
  std::vector<double,_std::allocator<double>_>::~vector(this_00);
  std::vector<double,_std::allocator<double>_>::~vector(this_00);
  std::vector<double,_std::allocator<double>_>::~vector(this_00);
  std::vector<double,_std::allocator<double>_>::~vector(this_00);
  std::vector<double,_std::allocator<double>_>::~vector(this_00);
  std::vector<double,_std::allocator<double>_>::~vector(this_00);
  std::vector<double,_std::allocator<double>_>::~vector(this_00);
  std::vector<double,_std::allocator<double>_>::~vector(this_00);
  std::vector<double,_std::allocator<double>_>::~vector(this_00);
  std::vector<double,_std::allocator<double>_>::~vector(this_00);
  std::vector<double,_std::allocator<double>_>::~vector(this_00);
  std::vector<double,_std::allocator<double>_>::~vector(this_00);
  std::vector<double,_std::allocator<double>_>::~vector(this_00);
  std::vector<double,_std::allocator<double>_>::~vector(this_00);
  std::vector<double,_std::allocator<double>_>::~vector(this_00);
  std::vector<double,_std::allocator<double>_>::~vector(this_00);
  return;
}

Assistant:

void singleParticleSpectra::calculate_three_particle_correlation_charge_dep(
    vector<double> &event_Qn_p_real, vector<double> &event_Qn_p_imag,
    vector<double> &event_Qn_m_real, vector<double> &event_Qn_m_imag,
    vector<double> &event_Qn_real, vector<double> &event_Qn_imag,
    vector<double> &corr_ss, vector<double> &corr_ss_err,
    vector<double> &corr_os, vector<double> &corr_os_err,
    vector<double> &corr_ss_13, vector<double> &corr_ss_13_err,
    vector<double> &corr_os_13, vector<double> &corr_os_13_err) {
    vector<double> temp_Cmnk_ss_1(num_corr, 0.);
    vector<double> temp_Cmnk_ss_2(num_corr, 0.);
    vector<double> temp_Cmnk_ss_3(num_corr, 0.);
    vector<double> temp_Cmnk_ss_4(num_corr, 0.);
    vector<double> temp_Cmnk_ss_1_err(num_corr, 0.);
    vector<double> temp_Cmnk_ss_2_err(num_corr, 0.);
    vector<double> temp_Cmnk_ss_3_err(num_corr, 0.);
    vector<double> temp_Cmnk_ss_4_err(num_corr, 0.);
    calculate_three_particle_correlation(
        event_Qn_p_real, event_Qn_p_imag, event_Qn_p_real, event_Qn_p_imag,
        event_Qn_real, event_Qn_imag, 0, temp_Cmnk_ss_1, temp_Cmnk_ss_1_err);
    calculate_three_particle_correlation(
        event_Qn_m_real, event_Qn_m_imag, event_Qn_m_real, event_Qn_m_imag,
        event_Qn_real, event_Qn_imag, 0, temp_Cmnk_ss_2, temp_Cmnk_ss_2_err);
    calculate_three_particle_correlation(
        event_Qn_p_real, event_Qn_p_imag, event_Qn_real, event_Qn_imag,
        event_Qn_p_real, event_Qn_p_imag, 3, temp_Cmnk_ss_3,
        temp_Cmnk_ss_3_err);
    calculate_three_particle_correlation(
        event_Qn_m_real, event_Qn_m_imag, event_Qn_real, event_Qn_imag,
        event_Qn_m_real, event_Qn_m_imag, 3, temp_Cmnk_ss_4,
        temp_Cmnk_ss_4_err);
    for (int i = 0; i < num_corr; i++) {
        double local_Cmnk_ss = temp_Cmnk_ss_1[i] + temp_Cmnk_ss_2[i];
        corr_ss[i] += local_Cmnk_ss;
        corr_ss_err[i] += local_Cmnk_ss * local_Cmnk_ss;
        double local_Cmnk_ss_13 = temp_Cmnk_ss_3[i] + temp_Cmnk_ss_4[i];
        corr_ss_13[i] += local_Cmnk_ss_13;
        corr_ss_13_err[i] += local_Cmnk_ss_13 * local_Cmnk_ss_13;
    }

    vector<double> temp_Cmnk_os_1(num_corr, 0.);
    vector<double> temp_Cmnk_os_2(num_corr, 0.);
    vector<double> temp_Cmnk_os_3(num_corr, 0.);
    vector<double> temp_Cmnk_os_4(num_corr, 0.);
    vector<double> temp_Cmnk_os_1_err(num_corr, 0.);
    vector<double> temp_Cmnk_os_2_err(num_corr, 0.);
    vector<double> temp_Cmnk_os_3_err(num_corr, 0.);
    vector<double> temp_Cmnk_os_4_err(num_corr, 0.);
    calculate_three_particle_correlation(
        event_Qn_p_real, event_Qn_p_imag, event_Qn_m_real, event_Qn_m_imag,
        event_Qn_real, event_Qn_imag, 1, temp_Cmnk_os_1, temp_Cmnk_os_1_err);
    calculate_three_particle_correlation(
        event_Qn_m_real, event_Qn_m_imag, event_Qn_p_real, event_Qn_p_imag,
        event_Qn_real, event_Qn_imag, 1, temp_Cmnk_os_2, temp_Cmnk_os_2_err);
    calculate_three_particle_correlation(
        event_Qn_p_real, event_Qn_p_imag, event_Qn_real, event_Qn_imag,
        event_Qn_m_real, event_Qn_m_imag, 4, temp_Cmnk_os_3,
        temp_Cmnk_os_3_err);
    calculate_three_particle_correlation(
        event_Qn_m_real, event_Qn_m_imag, event_Qn_real, event_Qn_imag,
        event_Qn_p_real, event_Qn_p_imag, 4, temp_Cmnk_os_4,
        temp_Cmnk_os_4_err);
    for (int i = 0; i < num_corr; i++) {
        double local_Cmnk_os = temp_Cmnk_os_1[i] + temp_Cmnk_os_2[i];
        corr_os[i] += local_Cmnk_os;
        corr_os_err[i] += local_Cmnk_os * local_Cmnk_os;
        double local_Cmnk_os_13 = temp_Cmnk_os_3[i] + temp_Cmnk_os_4[i];
        corr_os_13[i] += local_Cmnk_os_13;
        corr_os_13_err[i] += local_Cmnk_os_13 * local_Cmnk_os_13;
    }
}